

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall
crnlib::mipmapped_texture::set_orientation_flags(mipmapped_texture *this,orientation_flags_t flags)

{
  vector<crnlib::mip_level_*> *pvVar1;
  mip_level **ppmVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = (ulong)(this->m_faces).m_size;
  if (uVar3 != 0) {
    pvVar1 = (this->m_faces).m_p;
    uVar4 = 0;
    do {
      uVar5 = (ulong)pvVar1[uVar4].m_size;
      if (uVar5 != 0) {
        ppmVar2 = pvVar1[uVar4].m_p;
        uVar6 = 0;
        do {
          ppmVar2[uVar6]->m_orient_flags = flags;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void mipmapped_texture::set_orientation_flags(orientation_flags_t flags) {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      m_faces[l][m]->set_orientation_flags(flags);
}